

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_map_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableMapFieldGenerator::ImmutableMapFieldGenerator
          (ImmutableMapFieldGenerator *this,FieldDescriptor *descriptor,int messageBitIndex,
          int builderBitIndex,Context *context)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  _Rb_tree_header *p_Var1;
  Type TVar2;
  JavaType type;
  ClassNameResolver *pCVar3;
  FieldGeneratorInfo *info;
  Descriptor *pDVar4;
  mapped_type *pmVar5;
  LogMessage *pLVar6;
  FieldDescriptor *field;
  int bitIndex;
  int bitIndex_00;
  FieldDescriptor *field_00;
  FieldDescriptor *field_01;
  FieldDescriptor *field_02;
  Descriptor *descriptor_00;
  key_type *this_00;
  undefined1 boxed;
  undefined7 uVar7;
  key_type kStack_158;
  key_type local_138;
  allocator<char> local_111;
  FieldDescriptor *local_110;
  FieldDescriptor *local_108;
  key_type local_100;
  allocator<char> local_d9;
  uint local_d8;
  JavaType local_d4;
  string boxed_key_type;
  key_type local_90;
  key_type local_70;
  key_type local_50;
  
  boxed = SUB81(context,0);
  uVar7 = (undefined7)((ulong)context >> 8);
  this_00 = &kStack_158;
  (this->super_ImmutableFieldGenerator)._vptr_ImmutableFieldGenerator =
       (_func_int **)&PTR__ImmutableMapFieldGenerator_004287e8;
  this->descriptor_ = descriptor;
  variables = &this->variables_;
  p_Var1 = &(this->variables_)._M_t._M_impl.super__Rb_tree_header;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_d8 = builderBitIndex;
  pCVar3 = Context::GetNameResolver(context);
  this->name_resolver_ = pCVar3;
  info = Context::GetFieldGeneratorInfo(context,descriptor);
  SetCommonFieldVariables(descriptor,info,variables);
  local_110 = (FieldDescriptor *)Context::GetNameResolver(context);
  pDVar4 = FieldDescriptor::message_type(descriptor);
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            (&boxed_key_type,(ClassNameResolver *)local_110,pDVar4);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&kStack_158,"type",(allocator<char> *)&local_138);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&kStack_158);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&boxed_key_type);
  std::__cxx11::string::~string((string *)&kStack_158);
  std::__cxx11::string::~string((string *)&boxed_key_type);
  TVar2 = FieldDescriptor::type(descriptor);
  if (TVar2 != TYPE_MESSAGE) {
    internal::LogMessage::LogMessage
              ((LogMessage *)&boxed_key_type,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_map_field.cc"
               ,0x2f);
    pLVar6 = internal::LogMessage::operator<<
                       ((LogMessage *)&boxed_key_type,
                        "CHECK failed: (FieldDescriptor::TYPE_MESSAGE) == (descriptor->type()): ");
    internal::LogFinisher::operator=((LogFinisher *)&kStack_158,pLVar6);
    internal::LogMessage::~LogMessage((LogMessage *)&boxed_key_type);
  }
  pDVar4 = FieldDescriptor::message_type(descriptor);
  if (*(char *)(*(long *)(pDVar4 + 0x20) + 0x6b) == '\0') {
    internal::LogMessage::LogMessage
              ((LogMessage *)&boxed_key_type,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_map_field.cc"
               ,0x31);
    pLVar6 = internal::LogMessage::operator<<
                       ((LogMessage *)&boxed_key_type,
                        "CHECK failed: message->options().map_entry(): ");
    internal::LogFinisher::operator=((LogFinisher *)&kStack_158,pLVar6);
    internal::LogMessage::~LogMessage((LogMessage *)&boxed_key_type);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&boxed_key_type,"key",(allocator<char> *)&kStack_158);
  field = Descriptor::FindFieldByName(pDVar4,&boxed_key_type);
  std::__cxx11::string::~string((string *)&boxed_key_type);
  local_108 = anon_unknown_1::ValueField(descriptor);
  local_d4 = GetJavaType(field);
  type = GetJavaType(local_108);
  (anonymous_namespace)::TypeName_abi_cxx11_
            (&boxed_key_type,(_anonymous_namespace_ *)field,local_110,(ClassNameResolver *)0x0,
             (bool)boxed);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&kStack_158,"key_type",(allocator<char> *)&local_138);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&kStack_158);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&boxed_key_type);
  std::__cxx11::string::~string((string *)&kStack_158);
  std::__cxx11::string::~string((string *)&boxed_key_type);
  (anonymous_namespace)::TypeName_abi_cxx11_
            (&boxed_key_type,(_anonymous_namespace_ *)field,local_110,(ClassNameResolver *)0x1,
             (bool)boxed);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&kStack_158,"boxed_key_type",(allocator<char> *)&local_138);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&kStack_158);
  std::__cxx11::string::_M_assign((string *)pmVar5);
  std::__cxx11::string::~string((string *)&kStack_158);
  std::__cxx11::string::rfind((char)&boxed_key_type,0x2e);
  std::__cxx11::string::substr((ulong)&kStack_158,(ulong)&boxed_key_type);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"short_key_type",(allocator<char> *)&local_100);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_138);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&kStack_158);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&kStack_158);
  (anonymous_namespace)::WireType_abi_cxx11_(&kStack_158,(_anonymous_namespace_ *)field,field_00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"key_wire_type",(allocator<char> *)&local_100);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_138);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&kStack_158);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&kStack_158);
  DefaultValue_abi_cxx11_
            (&kStack_158,(java *)field,(FieldDescriptor *)0x1,SUB81(local_110,0),
             (ClassNameResolver *)CONCAT71(uVar7,boxed));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"key_default_value",(allocator<char> *)&local_100);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_138);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&kStack_158);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&kStack_158);
  IsReferenceType(local_d4);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&kStack_158,"key_null_check",(allocator<char> *)&local_138);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&kStack_158);
  std::__cxx11::string::assign((char *)pmVar5);
  std::__cxx11::string::~string((string *)&kStack_158);
  IsReferenceType(type);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&kStack_158,"value_null_check",(allocator<char> *)&local_138);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&kStack_158);
  std::__cxx11::string::assign((char *)pmVar5);
  std::__cxx11::string::~string((string *)&kStack_158);
  if (type == JAVATYPE_ENUM) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&kStack_158,"value_type",(allocator<char> *)&local_138);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&kStack_158);
    std::__cxx11::string::assign((char *)pmVar5);
    std::__cxx11::string::~string((string *)&kStack_158);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&kStack_158,"boxed_value_type",(allocator<char> *)&local_138);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&kStack_158);
    std::__cxx11::string::assign((char *)pmVar5);
    std::__cxx11::string::~string((string *)&kStack_158);
    (anonymous_namespace)::WireType_abi_cxx11_
              (&kStack_158,(_anonymous_namespace_ *)local_108,field_01);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_138,"value_wire_type",(allocator<char> *)&local_100);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_138);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&kStack_158);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&kStack_158);
    DefaultValue_abi_cxx11_
              (&local_138,(java *)local_108,(FieldDescriptor *)0x1,SUB81(local_110,0),
               (ClassNameResolver *)CONCAT71(uVar7,boxed));
    std::operator+(&kStack_158,&local_138,".getNumber()");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"value_default_value",(allocator<char> *)&local_90);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_100);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&kStack_158);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&kStack_158);
    std::__cxx11::string::~string((string *)&local_138);
    (anonymous_namespace)::TypeName_abi_cxx11_
              (&kStack_158,(_anonymous_namespace_ *)local_108,local_110,(ClassNameResolver *)0x0,
               (bool)boxed);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_138,"value_enum_type",(allocator<char> *)&local_100);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_138);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&kStack_158);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&kStack_158);
    if (*(int *)(*(long *)(descriptor + 0x30) + 0x8c) == 3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_138,"value_enum_type",(allocator<char> *)&local_90);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](variables,&local_138);
      std::operator+(&kStack_158,pmVar5,".UNRECOGNIZED");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_100,"unrecognized_value",(allocator<char> *)&local_70);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](variables,&local_100);
      std::__cxx11::string::operator=((string *)pmVar5,(string *)&kStack_158);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&kStack_158);
      this_00 = &local_138;
      goto LAB_002acb8f;
    }
    DefaultValue_abi_cxx11_
              (&kStack_158,(java *)local_108,(FieldDescriptor *)0x1,SUB81(local_110,0),
               (ClassNameResolver *)CONCAT71(uVar7,boxed));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_138,"unrecognized_value",(allocator<char> *)&local_100);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_138);
  }
  else {
    (anonymous_namespace)::TypeName_abi_cxx11_
              (&kStack_158,(_anonymous_namespace_ *)local_108,local_110,(ClassNameResolver *)0x0,
               (bool)boxed);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_138,"value_type",(allocator<char> *)&local_100);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_138);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&kStack_158);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&kStack_158);
    (anonymous_namespace)::TypeName_abi_cxx11_
              (&kStack_158,(_anonymous_namespace_ *)local_108,local_110,(ClassNameResolver *)0x1,
               (bool)boxed);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_138,"boxed_value_type",(allocator<char> *)&local_100);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_138);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&kStack_158);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&kStack_158);
    (anonymous_namespace)::WireType_abi_cxx11_
              (&kStack_158,(_anonymous_namespace_ *)local_108,field_02);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_138,"value_wire_type",(allocator<char> *)&local_100);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_138);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&kStack_158);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&kStack_158);
    DefaultValue_abi_cxx11_
              (&kStack_158,(java *)local_108,(FieldDescriptor *)0x1,SUB81(local_110,0),
               (ClassNameResolver *)CONCAT71(uVar7,boxed));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_138,"value_default_value",(allocator<char> *)&local_100);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,&local_138);
  }
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&kStack_158);
  std::__cxx11::string::~string((string *)&local_138);
LAB_002acb8f:
  std::__cxx11::string::~string((string *)this_00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,"boxed_key_type",(allocator<char> *)&local_50);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_100);
  std::operator+(&local_138,pmVar5,", ");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"boxed_value_type",&local_111);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_90);
  std::operator+(&kStack_158,&local_138,pmVar5);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"type_parameters",&local_d9);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_70);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&kStack_158);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&kStack_158);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&kStack_158,"deprecation",(allocator<char> *)&local_138);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&kStack_158);
  std::__cxx11::string::assign((char *)pmVar5);
  std::__cxx11::string::~string((string *)&kStack_158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&kStack_158,"on_changed",(allocator<char> *)&local_138);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&kStack_158);
  std::__cxx11::string::assign((char *)pmVar5);
  std::__cxx11::string::~string((string *)&kStack_158);
  GenerateGetBitMutableLocal_abi_cxx11_(&kStack_158,(java *)(ulong)local_d8,bitIndex);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"get_mutable_bit_parser",(allocator<char> *)&local_100);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_138);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&kStack_158);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&kStack_158);
  GenerateSetBitMutableLocal_abi_cxx11_(&kStack_158,(java *)(ulong)local_d8,bitIndex_00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"set_mutable_bit_parser",(allocator<char> *)&local_100);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_138);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&kStack_158);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&kStack_158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"capitalized_name",(allocator<char> *)&local_90);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_138);
  std::operator+(&kStack_158,pmVar5,"DefaultEntryHolder.defaultEntry");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,"default_entry",(allocator<char> *)&local_70);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_100);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&kStack_158);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&kStack_158);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&kStack_158,"default_entry",(allocator<char> *)&local_100);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator[](variables,&kStack_158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"map_field_parameter",(allocator<char> *)&local_90);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_138);
  std::__cxx11::string::_M_assign((string *)pmVar5);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&kStack_158);
  ClassNameResolver::GetImmutableClassName<google::protobuf::FileDescriptor>
            (&local_90,(ClassNameResolver *)local_110,*(FileDescriptor **)(descriptor + 0x30));
  std::operator+(&local_100,&local_90,".internal_");
  pDVar4 = FieldDescriptor::message_type(descriptor);
  UniqueFileScopeIdentifier_abi_cxx11_(&local_70,(java *)pDVar4,descriptor_00);
  std::operator+(&local_138,&local_100,&local_70);
  std::operator+(&kStack_158,&local_138,"_descriptor, ");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"descriptor",&local_111);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_50);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&kStack_158);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&kStack_158);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_90);
  GeneratedCodeVersionSuffix_abi_cxx11_();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"ver",(allocator<char> *)&local_100);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_138);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&kStack_158);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&kStack_158);
  std::__cxx11::string::~string((string *)&boxed_key_type);
  return;
}

Assistant:

ImmutableMapFieldGenerator::
ImmutableMapFieldGenerator(const FieldDescriptor* descriptor,
                                       int messageBitIndex,
                                       int builderBitIndex,
                                       Context* context)
  : descriptor_(descriptor), name_resolver_(context->GetNameResolver())  {
  SetMessageVariables(descriptor, messageBitIndex, builderBitIndex,
                      context->GetFieldGeneratorInfo(descriptor),
                      context, &variables_);
}